

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_ssim.cpp
# Opt level: O3

void basisu::add_image(imagef *src1,imagef *src2,imagef *dst)

{
  vec<4U,_float> *pvVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  uint uVar8;
  uint32_t uVar9;
  uint uVar10;
  uint uVar11;
  vec<4U,_float> *pvVar12;
  uint uVar13;
  vec<4U,_float> *pvVar14;
  uint uVar15;
  bool bVar16;
  vec4F local_28;
  
  local_28.m_v[0] = 0.0;
  local_28.m_v[1] = 0.0;
  local_28.m_v[2] = 0.0;
  local_28.m_v[3] = 1.0;
  imagef::crop(dst,src1->m_width,src1->m_height,0xffffffff,&local_28);
  uVar9 = dst->m_height;
  if (0 < (int)uVar9) {
    uVar11 = dst->m_width;
    uVar8 = 0;
    do {
      bVar16 = uVar11 != 0;
      uVar11 = 0;
      if (bVar16) {
        uVar10 = 0;
        do {
          if ((src1->m_width <= uVar10) || (src1->m_height <= uVar8)) {
LAB_0024f690:
            __assert_fail("x < m_width && y < m_height",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_enc.h"
                          ,0xc3d,"const vec4F &basisu::imagef::operator()(uint32_t, uint32_t) const"
                         );
          }
          uVar11 = src1->m_pitch * uVar8 + uVar10;
          if ((src1->m_pixels).m_size <= uVar11) {
LAB_0024f6af:
            __assert_fail("i < m_size",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/../transcoder/basisu_containers.h"
                          ,0x177,
                          "const T &basisu::vector<basisu::vec<4, float>>::operator[](size_t) const [T = basisu::vec<4, float>]"
                         );
          }
          if ((src2->m_width <= uVar10) || (src2->m_height <= uVar8)) goto LAB_0024f690;
          uVar13 = src2->m_pitch * uVar8 + uVar10;
          if ((src2->m_pixels).m_size <= uVar13) goto LAB_0024f6af;
          if (dst->m_height <= uVar8) {
            __assert_fail("x < m_width && y < m_height",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_enc.h"
                          ,0xc3e,"vec4F &basisu::imagef::operator()(uint32_t, uint32_t)");
          }
          uVar15 = dst->m_pitch * uVar8 + uVar10;
          if ((dst->m_pixels).m_size <= uVar15) {
            __assert_fail("i < m_size",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/../transcoder/basisu_containers.h"
                          ,0x178,
                          "T &basisu::vector<basisu::vec<4, float>>::operator[](size_t) [T = basisu::vec<4, float>]"
                         );
          }
          pvVar12 = (src1->m_pixels).m_p + uVar11;
          pvVar14 = (src2->m_pixels).m_p + uVar13;
          fVar2 = pvVar12->m_v[1];
          fVar3 = pvVar12->m_v[2];
          fVar4 = pvVar12->m_v[3];
          fVar5 = pvVar14->m_v[1];
          fVar6 = pvVar14->m_v[2];
          fVar7 = pvVar14->m_v[3];
          pvVar1 = (dst->m_pixels).m_p + uVar15;
          pvVar1->m_v[0] = pvVar14->m_v[0] + pvVar12->m_v[0];
          pvVar1->m_v[1] = fVar5 + fVar2;
          pvVar1->m_v[2] = fVar6 + fVar3;
          pvVar1->m_v[3] = fVar7 + fVar4;
          uVar10 = uVar10 + 1;
          uVar11 = dst->m_width;
        } while (uVar10 < uVar11);
        uVar9 = dst->m_height;
      }
      uVar8 = uVar8 + 1;
    } while ((int)uVar8 < (int)uVar9);
  }
  return;
}

Assistant:

void add_image(const imagef &src1, const imagef &src2, imagef &dst)
	{
		dst.resize(src1);

//#pragma omp parallel for
		for (int y = 0; y < (int)dst.get_height(); y++)
		{
			for (uint32_t x = 0; x < dst.get_width(); x++)
			{
				const vec4F &s1 = src1(x, y);
				const vec4F &s2 = src2(x, y);

				dst(x, y).set(s1[0] + s2[0], s1[1] + s2[1], s1[2] + s2[2], s1[3] + s2[3]);
			}
		}
	}